

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O0

void __thiscall MockNamedValueList::clear(MockNamedValueList *this)

{
  MockNamedValueListNode *pMVar1;
  MockNamedValueListNode *n;
  MockNamedValueList *this_local;
  
  while (this->head_ != (MockNamedValueListNode *)0x0) {
    pMVar1 = MockNamedValueListNode::next(this->head_);
    MockNamedValueListNode::destroy(this->head_);
    if (this->head_ != (MockNamedValueListNode *)0x0) {
      operator_delete(this->head_,0x10);
    }
    this->head_ = pMVar1;
  }
  return;
}

Assistant:

void MockNamedValueList::clear()
{
    while (head_) {
        MockNamedValueListNode* n = head_->next();
        head_->destroy();
        delete head_;
        head_ = n;
    }
}